

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithRGBAQuads(PixelBufferAccess *dst)

{
  deBool dVar1;
  int iVar2;
  InternalError *this;
  Vector<float,_4> local_110;
  PixelBufferAccess local_100;
  Vector<float,_4> local_d8;
  PixelBufferAccess local_c8;
  Vector<float,_4> local_a0;
  PixelBufferAccess local_90;
  Vector<float,_4> local_68;
  PixelBufferAccess local_58;
  int local_2c;
  int local_28;
  int top;
  int left;
  int height;
  int width;
  ConstPixelBufferAccess *local_10;
  PixelBufferAccess *dst_local;
  
  local_10 = &dst->super_ConstPixelBufferAccess;
  while( true ) {
    dVar1 = ::deGetFalse();
    if (dVar1 != 0) break;
    iVar2 = ConstPixelBufferAccess::getDepth(local_10);
    if (iVar2 != 1) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      left = ConstPixelBufferAccess::getWidth(local_10);
      top = ConstPixelBufferAccess::getHeight(local_10);
      local_28 = left / 2;
      local_2c = top / 2;
      getSubregion(&local_58,(PixelBufferAccess *)local_10,0,0,0,local_28,local_2c,1);
      Vector<float,_4>::Vector(&local_68,1.0,0.0,0.0,1.0);
      clear(&local_58,&local_68);
      getSubregion(&local_90,(PixelBufferAccess *)local_10,local_28,0,0,left - local_28,local_2c,1);
      Vector<float,_4>::Vector(&local_a0,0.0,1.0,0.0,1.0);
      clear(&local_90,&local_a0);
      getSubregion(&local_c8,(PixelBufferAccess *)local_10,0,local_2c,0,local_28,top - local_2c,1);
      Vector<float,_4>::Vector(&local_d8,0.0,0.0,1.0,0.0);
      clear(&local_c8,&local_d8);
      getSubregion(&local_100,(PixelBufferAccess *)local_10,local_28,local_2c,0,left - local_28,
                   top - local_2c,1);
      Vector<float,_4>::Vector(&local_110,0.5,0.5,0.5,1.0);
      clear(&local_100,&local_110);
      return;
    }
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3c8);
  __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

void fillWithRGBAQuads (const PixelBufferAccess& dst)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	int width	= dst.getWidth();
	int height	= dst.getHeight();
	int	left	= width/2;
	int top		= height/2;

	clear(getSubregion(dst, 0,		0,		0, left,		top,		1),	Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, left,	0,		0, width-left,	top,		1),	Vec4(0.0f, 1.0f, 0.0f, 1.0f));
	clear(getSubregion(dst, 0,		top,	0, left,		height-top,	1), Vec4(0.0f, 0.0f, 1.0f, 0.0f));
	clear(getSubregion(dst, left,	top,	0, width-left,	height-top, 1), Vec4(0.5f, 0.5f, 0.5f, 1.0f));
}